

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_DeletedKey_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  char **lhs;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffe28;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe30;
  char **in_stack_fffffffffffffe38;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int iVar3;
  char *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea8;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  AssertionResult local_130;
  key_type local_120;
  size_type local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  key_type local_e8;
  size_type local_d0;
  undefined4 local_c4;
  AssertionResult local_c0 [3];
  key_type local_90;
  key_type local_88;
  AssertionResult local_80;
  key_type local_70;
  value_type local_40;
  value_type local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  bVar1 = google::
          HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_deleted_key
                    ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_00 = (AssertHelper *)(in_RDI + 0x10);
    local_10 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8._M_head_impl);
    local_40 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8._M_head_impl);
    local_70 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_88 = google::
               BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xe71afb);
    local_90 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
               ,(char **)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe71b79);
      type = (Type)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Message *)in_stack_fffffffffffffea8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xe71bd6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe71c44);
    local_c4 = 2;
    local_d0 = google::
               BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xe71c5d);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
               (uint *)in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
    iVar3 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe50 =
           testing::AssertionResult::failure_message((AssertionResult *)0xe71cd6);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe50,iVar3,(char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Message *)in_stack_fffffffffffffea8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xe71d33);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe71da4);
    pcVar2 = (char *)(in_RDI + 0x10);
    local_e8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_fc = 1;
    local_108 = google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xe71df2);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,(char *)in_stack_fffffffffffffe40,(uint *)in_stack_fffffffffffffe38,
               (unsigned_long *)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe40 =
           (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xe71e6b);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe50,(int)((ulong)pcVar2 >> 0x20),
                 (char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Message *)in_stack_fffffffffffffea8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xe71ec8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe71f39);
    lhs = (char **)(in_RDI + 0x10);
    local_120 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)lhs >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe71f7c);
    HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)lhs >> 0x20));
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              (pcVar2,(char *)in_stack_fffffffffffffe40,lhs,(char **)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffe30 =
           (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xe7200c);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe50,(int)((ulong)pcVar2 >> 0x20),
                 (char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Message *)in_stack_fffffffffffffea8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xe72069);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe720d7);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)0xe720ed);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (pcVar2,(char *)in_stack_fffffffffffffe40,(uint *)lhs,
               (unsigned_long *)in_stack_fffffffffffffe30);
    iVar3 = (int)((ulong)pcVar2 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffea0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::AssertionResult::failure_message((AssertionResult *)0xe72151);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,in_stack_fffffffffffffe50,iVar3,(char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Message *)in_stack_fffffffffffffea8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xe7219d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe721ff);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, DeletedKey) {
  if (!this->ht_.supports_deleted_key()) return;
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(1));
  EXPECT_EQ(2u, this->ht_.size());
  this->ht_.erase(this->UniqueKey(20));
  EXPECT_EQ(1u, this->ht_.size());

  // Changing the deleted key is fine.
  this->ht_.set_deleted_key(this->UniqueKey(2));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(2));
  EXPECT_EQ(1u, this->ht_.size());
}